

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O3

void __thiscall
wabt::interp::RefPtr<wabt::interp::Global>::RefPtr
          (RefPtr<wabt::interp::Global> *this,Store *store,Ref ref)

{
  ExternKind EVar1;
  GlobalType *expected;
  bool bVar2;
  Result RVar3;
  Index IVar4;
  unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_> *puVar5;
  GlobalType *in_RCX;
  undefined8 *extraout_RDX;
  Store *this_00;
  undefined8 *in_R8;
  char *pcVar6;
  string sStack_b0;
  vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> vStack_90;
  RefPtr<wabt::interp::Trap> RStack_70;
  Store *pSStack_58;
  Ref local_20;
  
  bVar2 = Store::Is<wabt::interp::Global>(store,ref);
  if (!bVar2) {
    this_00 = store;
    interp::RefPtr();
    expected = (GlobalType *)extraout_RDX[8];
    EVar1 = (expected->super_ExternType).kind;
    pSStack_58 = store;
    if (expected == (GlobalType *)0x0 || (long)(int)EVar1 != 3) {
      if ((int)EVar1 < 5) {
        pcVar6 = (char *)(&g_kind_name)[(int)EVar1];
      }
      else {
        pcVar6 = "<error_kind>";
      }
      StringPrintf_abi_cxx11_
                (&sStack_b0,"expected import \"%s.%s\" to have kind %s, not %s",*extraout_RDX,
                 extraout_RDX[4],pcVar6,_DAT_001a8298);
      vStack_90.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vStack_90.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vStack_90.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      Store::
      Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
                (&RStack_70,this_00,this_00,&sStack_b0,&vStack_90);
      *in_R8 = RStack_70.obj_;
      in_R8[1] = RStack_70.store_;
      in_R8[2] = RStack_70.root_index_;
      RStack_70.root_index_ = 0;
      RStack_70.obj_ = (Trap *)0x0;
      RStack_70.store_ = (Store *)0x0;
      if (vStack_90.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(vStack_90.
                        super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_b0._M_dataplus._M_p != &sStack_b0.field_2) {
        operator_delete(sStack_b0._M_dataplus._M_p);
      }
    }
    else {
      sStack_b0._M_string_length = 0;
      sStack_b0.field_2._M_local_buf[0] = '\0';
      sStack_b0._M_dataplus._M_p = (pointer)&sStack_b0.field_2;
      RVar3 = Match(expected,in_RCX,&sStack_b0);
      if (RVar3.enum_ == Error) {
        vStack_90.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vStack_90.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        vStack_90.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        Store::
        Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
                  (&RStack_70,this_00,this_00,&sStack_b0,&vStack_90);
        *in_R8 = RStack_70.obj_;
        in_R8[1] = RStack_70.store_;
        in_R8[2] = RStack_70.root_index_;
        RStack_70.root_index_ = 0;
        RStack_70.obj_ = (Trap *)0x0;
        RStack_70.store_ = (Store *)0x0;
        if (vStack_90.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(vStack_90.
                          super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_b0._M_dataplus._M_p != &sStack_b0.field_2) {
        operator_delete(sStack_b0._M_dataplus._M_p);
      }
    }
    return;
  }
  local_20.index = ref.index;
  IVar4 = FreeList<wabt::interp::Ref>::New<wabt::interp::Ref&>(&store->roots_,&local_20);
  this->root_index_ = IVar4;
  puVar5 = FreeList<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>
           ::Get(&store->objects_,ref.index);
  this->obj_ = (Global *)
               (puVar5->_M_t).
               super___uniq_ptr_impl<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>
               ._M_t.
               super__Tuple_impl<0UL,_wabt::interp::Object_*,_std::default_delete<wabt::interp::Object>_>
               .super__Head_base<0UL,_wabt::interp::Object_*,_false>._M_head_impl;
  this->store_ = store;
  return;
}

Assistant:

RefPtr<T>::RefPtr(Store& store, Ref ref) {
#ifndef NDEBUG
  if (!store.Is<T>(ref)) {
    ObjectKind ref_kind;
    if (ref == Ref::Null) {
      ref_kind = ObjectKind::Null;
    } else {
      ref_kind = store.objects_.Get(ref.index)->kind();
    }
    fprintf(stderr, "Invalid conversion from Ref (%s) to RefPtr<%s>!\n",
            GetName(ref_kind), T::GetTypeName());
    abort();
  }
#endif
  root_index_ = store.NewRoot(ref);
  obj_ = static_cast<T*>(store.objects_.Get(ref.index).get());
  store_ = &store;
}